

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O0

void __thiscall
Eigen::
CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>_>
::CwiseBinaryOp(CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                *this,Lhs *aLhs,Rhs *aRhs,scalar_sum_op<float,_float> *func)

{
  Index IVar1;
  Index IVar2;
  bool bVar3;
  scalar_sum_op<float,_float> *func_local;
  Rhs *aRhs_local;
  Lhs *aLhs_local;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
  *this_local;
  
  CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::Dense>
  ::CwiseBinaryOpImpl((CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::Dense>
                       *)this);
  (this->m_lhs).m_lhs.m_lhs.m_matrix = (aLhs->m_lhs).m_lhs.m_matrix;
  (this->m_lhs).m_lhs.m_rhs.m_diagonal = (aLhs->m_lhs).m_rhs.m_diagonal;
  (this->m_lhs).m_rhs = aLhs->m_rhs;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp(&this->m_rhs,aRhs);
  internal::scalar_sum_op<float,_float>::scalar_sum_op
            ((scalar_sum_op<float,_float> *)&this->field_0x58,func);
  IVar1 = Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>
          ::rows(aLhs);
  IVar2 = CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>
          ::rows(aRhs);
  bVar3 = false;
  if (IVar1 == IVar2) {
    IVar1 = Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>
            ::cols(aLhs);
    IVar2 = CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>
            ::cols(aRhs);
    bVar3 = IVar1 == IVar2;
  }
  if (!bVar3) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Product<Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, -1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>, Eigen::Matrix<float, -1, -1>>>]"
                 );
  }
  return;
}

Assistant:

CwiseBinaryOp(const Lhs& aLhs, const Rhs& aRhs, const BinaryOp& func = BinaryOp())
      : m_lhs(aLhs), m_rhs(aRhs), m_functor(func)
    {
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename Rhs::Scalar);
      // require the sizes to match
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs, Rhs)
      eigen_assert(aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols());
    }